

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O2

void * __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,size_t size)

{
  bool bVar1;
  size_t sVar2;
  void *pvVar3;
  ChunkHeader *pCVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (this->shared_->refcount == 0) {
    __assert_fail("shared_->refcount > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/allocators.h"
                  ,0x142,
                  "void *rapidjson::MemoryPoolAllocator<>::Malloc(size_t) [BaseAllocator = rapidjson::CrtAllocator]"
                 );
  }
  if (size == 0) {
LAB_0010d3d9:
    pvVar3 = (void *)0x0;
  }
  else {
    uVar5 = size + 7 & 0xfffffffffffffff8;
    pCVar4 = this->shared_->chunkHead;
    sVar2 = pCVar4->size;
    uVar6 = sVar2 + uVar5;
    if (pCVar4->capacity < uVar6) {
      uVar6 = this->chunk_capacity_;
      if (this->chunk_capacity_ <= uVar5) {
        uVar6 = uVar5;
      }
      bVar1 = AddChunk(this,uVar6);
      if (!bVar1) goto LAB_0010d3d9;
      pCVar4 = this->shared_->chunkHead;
      sVar2 = pCVar4->size;
      uVar6 = uVar5 + sVar2;
    }
    pvVar3 = (void *)((long)&pCVar4[1].capacity + sVar2);
    pCVar4->size = uVar6;
  }
  return pvVar3;
}

Assistant:

void* Malloc(size_t size) {
        RAPIDJSON_NOEXCEPT_ASSERT(shared_->refcount > 0);
        if (!size)
            return NULL;

        size = RAPIDJSON_ALIGN(size);
        if (RAPIDJSON_UNLIKELY(shared_->chunkHead->size + size > shared_->chunkHead->capacity))
            if (!AddChunk(chunk_capacity_ > size ? chunk_capacity_ : size))
                return NULL;

        void *buffer = GetChunkBuffer(shared_) + shared_->chunkHead->size;
        shared_->chunkHead->size += size;
        return buffer;
    }